

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cc
# Opt level: O0

void __thiscall benchmark::internal::BenchmarkImp::~BenchmarkImp(BenchmarkImp *this)

{
  string *in_RDI;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  
  std::vector<int,_std::allocator<int>_>::~vector(unaff_retaddr);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)unaff_retaddr);
  std::__cxx11::string::~string(in_RDI);
  return;
}

Assistant:

BenchmarkImp::~BenchmarkImp() {
}